

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeDumper.cpp
# Opt level: O2

void Js::ByteCodeDumper::
     DumpElementSlotI2<Js::OpLayoutT_ElementSlotI2<Js::LayoutSizePolicy<(Js::LayoutSize)2>>>
               (OpCode op,OpLayoutT_ElementSlotI2<Js::LayoutSizePolicy<(Js::LayoutSize)2>_> *data,
               FunctionBody *dumpFunction,ByteCodeReader *reader)

{
  uint uVar1;
  uint uVar2;
  code *pcVar3;
  int iVar4;
  bool bVar5;
  uint uVar6;
  undefined4 *puVar7;
  undefined6 in_register_0000003a;
  char16_t *form;
  
  iVar4 = (int)CONCAT62(in_register_0000003a,op);
  uVar6 = iVar4 - 0x136;
  if (uVar6 < 0x1c) {
    if ((0xe846000U >> (uVar6 & 0x1f) & 1) != 0) goto LAB_007553f5;
    if ((0x501U >> (uVar6 & 0x1f) & 1) == 0) goto LAB_007553c9;
  }
  else {
LAB_007553c9:
    if (iVar4 - 0x94U < 2) {
LAB_007553f5:
      uVar6 = data->SlotIndex1;
      uVar1 = data->SlotIndex2;
      uVar2 = data->Value;
      form = L" [%d][%d] = R%d ";
      goto LAB_00755404;
    }
    if ((iVar4 != 0x8e) && (iVar4 != 0x90)) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar7 = 1;
      bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeDumper.cpp"
                                  ,0x3b4,"(false)","Unknown OpCode for OpLayoutElementSlotI2");
      if (bVar5) {
        *puVar7 = 0;
        return;
      }
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
  }
  uVar6 = data->Value;
  uVar1 = data->SlotIndex1;
  uVar2 = data->SlotIndex2;
  form = L" R%d = [%d][%d] ";
LAB_00755404:
  Output::Print(form,(ulong)uVar6,(ulong)uVar1,(ulong)uVar2);
  return;
}

Assistant:

void ByteCodeDumper::DumpElementSlotI2(OpCode op, const unaligned T * data, Js::FunctionBody * dumpFunction, ByteCodeReader& reader)
    {
        switch (op)
        {
            case OpCode::StInnerSlot:
            case OpCode::StInnerSlotChkUndecl:
            case OpCode::StInnerObjSlot:
            case OpCode::StInnerObjSlotChkUndecl:
            case OpCode::StEnvSlot:
            case OpCode::StEnvObjSlot:
            case OpCode::StEnvSlotChkUndecl:
            case OpCode::StEnvObjSlotChkUndecl:
            case OpCode::StModuleSlot:
                Output::Print(_u(" [%d][%d] = R%d "),data->SlotIndex1, data->SlotIndex2, data->Value);
                break;
            case OpCode::LdInnerSlot:
            case OpCode::LdInnerObjSlot:
            case OpCode::LdEnvSlot:
            case OpCode::LdEnvObjSlot:
            case OpCode::LdModuleSlot:
                Output::Print(_u(" R%d = [%d][%d] "),data->Value, data->SlotIndex1, data->SlotIndex2);
                break;
            default:
            {
                AssertMsg(false, "Unknown OpCode for OpLayoutElementSlotI2");
                break;
            }
        }
    }